

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableWidgetItem::QTableWidgetItem(QTableWidgetItem *this,QString *text,int type)

{
  QTableWidgetItemPrivate *pQVar1;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QTableWidgetItem = (_func_int **)&PTR__QTableWidgetItem_0081d628;
  this->rtti = type;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QWidgetItemData *)0x0;
  (this->values).d.size = 0;
  this->view = (QTableWidget *)0x0;
  pQVar1 = (QTableWidgetItemPrivate *)operator_new(0x10);
  pQVar1->q = this;
  pQVar1->id = -1;
  pQVar1->headerItem = false;
  this->d = pQVar1;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x3f;
  ::QVariant::QVariant(&local_40,(QString *)text);
  (*this->_vptr_QTableWidgetItem[4])(this,0,&local_40);
  ::QVariant::~QVariant(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTableWidgetItem::QTableWidgetItem(const QString &text, int type)
    :  rtti(type), view(nullptr), d(new QTableWidgetItemPrivate(this)),
      itemFlags(Qt::ItemIsEditable
                |Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled
                |Qt::ItemIsDropEnabled)
{
    setData(Qt::DisplayRole, text);
}